

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void foreach_bit(bit_vec v,bv_func func,void *p1,void *p2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  uVar5 = 0;
  lVar6 = 0;
  do {
    if (v->len <= lVar6) {
      return;
    }
    uVar1 = (int)lVar6 * 8;
    iVar2 = 0;
    uVar4 = uVar5;
    for (iVar3 = 3; iVar3 != 0xb; iVar3 = iVar3 + 4) {
      uVar8 = iVar2 * 4;
      switch((int)v->vec[lVar6] >> ((char)iVar3 - 3U & 0x1f) & 0xf) {
      case 0:
        goto switchD_0010c94e_caseD_0;
      case 1:
        uVar8 = uVar8 | uVar1;
        break;
      case 2:
        uVar8 = uVar8 + uVar1 + 1;
        break;
      case 3:
        iVar7 = uVar4 + 1;
        goto LAB_0010ca6c;
      case 4:
        uVar8 = uVar8 + uVar1 + 2;
        break;
      case 5:
        iVar7 = uVar4 + 2;
        goto LAB_0010ca6c;
      case 6:
        iVar7 = uVar4 + 2;
        goto LAB_0010ca88;
      case 7:
        iVar7 = uVar4 + 2;
        goto LAB_0010ca1f;
      case 8:
        uVar8 = uVar8 + uVar1 + 3;
        break;
      case 9:
        iVar7 = uVar4 + 3;
        goto LAB_0010ca6c;
      case 10:
        iVar7 = uVar4 + 3;
        goto LAB_0010ca88;
      case 0xb:
        iVar7 = uVar4 + 3;
LAB_0010ca1f:
        (*func)(iVar7,p1,p2);
        iVar7 = uVar4 + 1;
        goto LAB_0010ca6c;
      case 0xc:
        (*func)(uVar4 + 3,p1,p2);
        uVar8 = uVar8 + uVar1 + 2;
        break;
      case 0xd:
        (*func)(uVar4 + 3,p1,p2);
        iVar7 = uVar4 + 2;
LAB_0010ca6c:
        uVar8 = uVar8 | uVar1;
        (*func)(iVar7,p1,p2);
        break;
      case 0xe:
        (*func)(uVar4 + 3,p1,p2);
        iVar7 = uVar4 + 2;
LAB_0010ca88:
        (*func)(iVar7,p1,p2);
        uVar8 = uVar8 + uVar1 + 1;
        break;
      case 0xf:
        (*func)(uVar4 + 3,p1,p2);
        (*func)(uVar4 + 2,p1,p2);
        (*func)(uVar4 + 1,p1,p2);
        uVar8 = uVar4;
      }
      (*func)(uVar8,p1,p2);
switchD_0010c94e_caseD_0:
      iVar2 = iVar2 + 1;
      uVar4 = uVar4 + 4;
    }
    lVar6 = lVar6 + 1;
    uVar5 = uVar5 + 8;
  } while( true );
}

Assistant:

void
foreach_bit(bit_vec v, bv_func func, void* p1, void* p2)
{
    int i;
    for (i = 0; i < v->len; i++) {
        int j;
        for (j = 0; j < 2; j++) {
            unsigned char nibble = (v->vec[i] >> (j * 4)) & 0xf;
            switch (nibble) {
            case 0xf:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xe:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0xd:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xc:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                break;
            case 0xb:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xa:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x9:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x8:
                func(i * 8 + j * 4 + 3, p1, p2);
                break;
            case 0x7:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x6:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x5:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x4:
                func(i * 8 + j * 4 + 2, p1, p2);
                break;
            case 0x3:
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x2:
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x1:
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x0:
                break;
            }
        }
    }
}